

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

wchar_t ignore_point(chunk_conflict *c,int *colors,loc grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t n;
  int *colors_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  wVar2 = grid_to_i(grid,c->width);
  _Var1 = square_in_bounds((chunk *)c,(loc_conflict)grid);
  if (_Var1) {
    if (colors[wVar2] == 0) {
      _Var1 = square_ispassable((chunk *)c,(loc_conflict)grid);
      if (_Var1) {
        grid_local.x = 0;
      }
      else {
        _Var1 = square_isdoor((chunk *)c,(loc_conflict)grid);
        if (_Var1) {
          grid_local.x = 0;
        }
        else {
          grid_local.x = 1;
        }
      }
    }
    else {
      grid_local.x = 1;
    }
  }
  else {
    grid_local.x = 1;
  }
  return grid_local.x;
}

Assistant:

static int ignore_point(struct chunk *c, int colors[], struct loc grid) {
	int n = grid_to_i(grid, c->width);

	if (!square_in_bounds(c, grid)) return true;
	if (colors[n]) return true;
	if (square_ispassable(c, grid)) return false;
	if (square_isdoor(c, grid)) return false;
	return true;
}